

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

void __thiscall kj::Exception::~Exception(Exception *this)

{
  Exception *this_local;
  
  Maybe<kj::Own<kj::Exception::Context>_>::~Maybe(&this->context);
  String::~String(&this->description);
  String::~String(&this->ownFile);
  return;
}

Assistant:

Exception::~Exception() noexcept {}